

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassembler.cpp
# Opt level: O2

void __thiscall LLVMBC::StreamState::append(StreamState *this,ExtractElementInst *extr,bool decl)

{
  undefined7 in_register_00000011;
  uint64_t local_48;
  Value *local_40;
  Value *local_38;
  Type *local_30;
  
  if ((int)CONCAT71(in_register_00000011,decl) == 0) {
    local_48 = Value::get_tween_id((Value *)extr);
    append<char_const(&)[2],unsigned_long>(this,(char (*) [2])0x1a7902,&local_48);
  }
  else {
    local_48 = Value::get_tween_id((Value *)extr);
    local_30 = Value::getType((Value *)extr);
    local_38 = ExtractElementInst::getVectorOperand(extr);
    local_40 = ExtractElementInst::getIndexOperand(extr);
    append<char_const(&)[2],unsigned_long,char_const(&)[19],LLVMBC::Type*,char_const(&)[2],LLVMBC::Value*,char_const(&)[3],LLVMBC::Value*>
              (this,(char (*) [2])0x1a7902,&local_48,(char (*) [19])" = extractelement ",&local_30,
               (char (*) [2])0x1a77b6,&local_38,(char (*) [3])", ",&local_40);
  }
  return;
}

Assistant:

void StreamState::append(ExtractElementInst *extr, bool decl)
{
	if (decl)
	{
		append("%", extr->get_tween_id(), " = extractelement ",
		       extr->getType(), " ", extr->getVectorOperand(), ", ", extr->getIndexOperand());
	}
	else
		append("%", extr->get_tween_id());
}